

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_open.c
# Opt level: O2

int mpt_connection_open(mpt_connection *con,char *to,mpt_fdmode *mp)

{
  uint uVar1;
  int flg;
  int iVar2;
  ulong uVar3;
  mpt_data_encoder_t p_Var4;
  mpt_buffer *__dest;
  mpt_socket tmp;
  mpt_fdmode mode;
  mpt_stream s;
  
  tmp._id = -1;
  if (((con->out).state & 0x10) != 0) {
    return -4;
  }
  if (to == (char *)0x0) {
    return -1;
  }
  if (mp == (mpt_fdmode *)0x0) {
    mp = &mode;
    uVar1 = mpt_mode_parse(mp,to);
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 0) {
      return uVar1;
    }
    mode.stream._0_1_ = (byte)mode.stream | 0x30;
  }
  else {
    uVar3 = 0;
  }
  flg = mpt_connect(&tmp,to + uVar3,mp);
  if (flg < 0) {
    return -2;
  }
  iVar2 = mpt_stream_sockflags(flg);
  if (iVar2 < 0) {
    __dest = (mpt_buffer *)0x0;
LAB_001051e4:
    mpt_connection_close(con);
    if (__dest == (mpt_buffer *)0x0) {
      (con->out).sock._id = tmp._id;
    }
    else {
      (con->out).buf._buf = __dest;
    }
  }
  else {
    memset(&s,0,0x98);
    s._rd._state.data.msg = -1;
    p_Var4 = (mpt_data_encoder_t)mpt_message_encoder(2);
    if (p_Var4 == (mpt_data_encoder_t)0x0) {
      return -8;
    }
    s._rd._dec = (mpt_data_decoder_t)mpt_message_decoder(2);
    if (s._rd._dec == (mpt_data_decoder_t)0x0) {
      return -8;
    }
    iVar2 = mpt_stream_dopen(&s,&tmp,(uint)mp->stream);
    if (iVar2 < 0) {
      close(tmp._id);
    }
    else {
      s._wd._enc = p_Var4;
      __dest = (mpt_buffer *)malloc(0x98);
      if (__dest != (mpt_buffer *)0x0) {
        memcpy(__dest,&s,0x98);
        goto LAB_001051e4;
      }
    }
    flg = -4;
  }
  return flg;
}

Assistant:

extern int mpt_connection_open(MPT_STRUCT(connection) *con, const char *to, const MPT_STRUCT(fdmode) *mp)
{
	MPT_STRUCT(fdmode) mode;
	MPT_STRUCT(socket) tmp = MPT_SOCKET_INIT;
	MPT_STRUCT(stream) *srm = 0;
	int flg = 0, ret;
	
	if (con->out.state & MPT_OUTFLAG(Active)) {
		return MPT_ERROR(BadOperation);
	}
	if (!to) {
		return MPT_ERROR(BadArgument);
	}
	/* get mode from target string */
	if (!mp) {
		if ((flg = mpt_mode_parse(&mode, to)) < 0) {
			return flg;
		}
		mode.stream |= MPT_STREAMFLAG(Buffer);
		mp = &mode;
	}
	/* create new connection */
	if ((ret = mpt_connect(&tmp, to+flg, mp)) < 0) {
		return MPT_ERROR(BadValue);
	}
	if ((flg = mpt_stream_sockflags(ret)) >= 0) {
		static const char encoding = MPT_ENUM(EncodingCobs);
		MPT_STRUCT(stream) s = MPT_STREAM_INIT;
		MPT_TYPE(data_encoder) enc;
		MPT_TYPE(data_decoder) dec;
		
		if (!(enc = mpt_message_encoder(encoding))
		    || !(dec = mpt_message_decoder(encoding))) {
			return MPT_ERROR(BadEncoding);
		}
		if (mpt_stream_dopen(&s, &tmp, mp->stream) < 0) {
			(void) close(tmp._id);
			return MPT_ERROR(BadOperation);
		}
		s._wd._enc = enc;
		s._rd._dec = dec;
		
		if (!(srm = malloc(sizeof(*srm)))) {
			return MPT_ERROR(BadOperation);
		}
		*srm = s;
	}
	/* close old connection */
	mpt_connection_close(con);
	
	/* set new connection parameters */
	if (srm) {
		con->out.buf._buf = (void *) srm;
	} else {
		con->out.sock = tmp;
	}
	return ret;
}